

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O3

vec2 vec2_perpindicular_component(vec2 u,vec2 v)

{
  vec2 vVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar2 = v.x;
  fVar3 = v.y;
  fVar4 = fVar2 * fVar2 + fVar3 * fVar3;
  fVar5 = 0.0;
  fVar6 = 0.0;
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    fVar4 = (u.x * fVar2 + u.y * fVar3) / fVar4;
    fVar5 = fVar4 * fVar2;
    fVar6 = fVar4 * fVar3;
  }
  vVar1.y = u.y - fVar6;
  vVar1.x = u.x - fVar5;
  return vVar1;
}

Assistant:

vec2 vec2_perpindicular_component(vec2 u, vec2 v) {
    return vec2_sub(u, vec2_parallel_component(u, v));
}